

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O0

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
postfixExpression(Tokenizer *tokenizer)

{
  bool bVar1;
  Token *pTVar2;
  ExpressionFunctionHandler *this;
  Identifier *name;
  size_type sVar3;
  Tokenizer *in_RSI;
  optional<ExpressionFunctionHandle> oVar4;
  bool local_61;
  undefined1 local_60 [8];
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  parameters;
  Identifier *functionName;
  undefined1 local_20;
  undefined8 local_18;
  Tokenizer *tokenizer_local;
  
  local_18 = in_RSI;
  tokenizer_local = tokenizer;
  pTVar2 = Tokenizer::peekToken(in_RSI,0);
  local_61 = false;
  if (pTVar2->type == Identifier) {
    pTVar2 = Tokenizer::peekToken((Tokenizer *)local_18,1);
    local_61 = false;
    if (pTVar2->type == LParen) {
      this = ExpressionFunctionHandler::instance();
      pTVar2 = Tokenizer::peekToken((Tokenizer *)local_18,0);
      name = Token::identifierValue(pTVar2);
      oVar4 = ExpressionFunctionHandler::find(this,name);
      functionName = oVar4.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
                     super__Optional_payload_base<ExpressionFunctionHandle>._M_payload;
      local_20 = oVar4.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
                 super__Optional_payload_base<ExpressionFunctionHandle>._M_engaged;
      local_61 = std::optional::operator_cast_to_bool((optional *)&functionName);
    }
  }
  if (local_61 == false) {
    primaryExpression(tokenizer);
  }
  else {
    pTVar2 = Tokenizer::nextToken((Tokenizer *)local_18);
    parameters.
    super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Token::identifierValue(pTVar2);
    Tokenizer::eatToken((Tokenizer *)local_18);
    std::
    vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
    ::vector((vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
              *)&stack0xffffffffffffffb8);
    do {
      pTVar2 = Tokenizer::peekToken((Tokenizer *)local_18,0);
      if (pTVar2->type == RParen) {
        Tokenizer::eatToken((Tokenizer *)local_18);
        std::
        make_unique<ExpressionInternal,Identifier_const&,std::vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>>
                  ((Identifier *)tokenizer,
                   (vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                    *)parameters.
                      super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
        ._M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
        .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl._0_4_ = 1;
        break;
      }
      sVar3 = std::
              vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
              ::size((vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                      *)&stack0xffffffffffffffb8);
      if ((sVar3 != 0) &&
         (pTVar2 = Tokenizer::nextToken((Tokenizer *)local_18), pTVar2->type != Comma)) {
        std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
        unique_ptr<std::default_delete<ExpressionInternal>,void>
                  ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)
                   tokenizer,(nullptr_t)0x0);
        exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
        ._M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
        .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl._0_4_ = 1;
        break;
      }
      expression((Tokenizer *)local_60);
      bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                               *)local_60,(nullptr_t)0x0);
      if (bVar1) {
        std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
        unique_ptr<std::default_delete<ExpressionInternal>,void>
                  ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)
                   tokenizer,(nullptr_t)0x0);
      }
      else {
        std::
        vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ::push_back((vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                     *)&stack0xffffffffffffffb8,(value_type *)local_60);
      }
      exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
      _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
      super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl._1_3_ = 0;
      exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
      _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
      super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl._0_1_ = bVar1;
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_60);
    } while ((uint)exp._M_t.
                   super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                   .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl == 0);
    std::
    vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
    ::~vector((vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               *)&stack0xffffffffffffffb8);
  }
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> postfixExpression(Tokenizer& tokenizer)
{
	if (tokenizer.peekToken(0).type == TokenType::Identifier &&
		tokenizer.peekToken(1).type == TokenType::LParen &&
		ExpressionFunctionHandler::instance().find(tokenizer.peekToken(0).identifierValue()))
	{
		const Identifier &functionName = tokenizer.nextToken().identifierValue();
		tokenizer.eatToken();

		std::vector<std::unique_ptr<ExpressionInternal>> parameters;
		while (tokenizer.peekToken().type != TokenType::RParen)
		{
			if (parameters.size() != 0 && tokenizer.nextToken().type != TokenType::Comma)
				return nullptr;

			std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);
			if (exp == nullptr)
				return nullptr;

			parameters.push_back(std::move(exp));
		}

		tokenizer.eatToken();

		return std::make_unique<ExpressionInternal>(functionName, std::move(parameters));
	}

	return primaryExpression(tokenizer);
}